

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::EglConfigSet::EglConfigSet(EglConfigSet *this)

{
  EglConfigSet *this_local;
  
  Item::Item(&this->super_Item,TYPE_EGLCONFIGSET);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfigSet_00141b50;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->description);
  List::List(&this->configs);
  return;
}

Assistant:

EglConfigSet		(void) : Item(TYPE_EGLCONFIGSET) {}